

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  node *n;
  server_t s;
  string local_448;
  _Any_data local_428;
  code *local_418;
  code *pcStack_410;
  _Any_data local_408;
  code *local_3f8;
  code *pcStack_3f0;
  _Any_data local_3e8;
  code *local_3d8;
  code *pcStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  code *local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  code *local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  code *local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  code *local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  code *local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  code *local_318;
  undefined8 uStack_310;
  server_t local_300;
  
  clask::server_t::server_t(&local_300);
  paVar1 = &local_448.field_2;
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"/","");
  local_328 = 0;
  uStack_320 = 0;
  n = &local_300.treeGET;
  local_418 = (code *)0x0;
  pcStack_410 = (code *)0x0;
  local_428._M_unused._M_object = (void *)0x0;
  local_428._8_8_ = 0;
  pcStack_3f0 = std::
                _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/main.cxx:6:14)>
                ::_M_invoke;
  local_408._M_unused._M_object = (void *)0x0;
  local_408._8_8_ = 0;
  local_3f8 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/main.cxx:6:14)>
              ::_M_manager;
  local_318 = (code *)0x0;
  uStack_310 = 0;
  local_3e8._M_unused._M_object = (void *)0x0;
  local_3e8._8_8_ = 0;
  local_3d8 = (code *)0x0;
  pcStack_3d0 = (code *)0x0;
  clask::server_t::parse_tree(&local_300,n,&local_448,(func_t *)&local_428);
  if (local_3d8 != (code *)0x0) {
    (*local_3d8)(&local_3e8,&local_3e8,__destroy_functor);
  }
  if (local_3f8 != (code *)0x0) {
    (*local_3f8)(&local_408,&local_408,__destroy_functor);
  }
  if (local_418 != (code *)0x0) {
    (*local_418)(&local_428,&local_428,3);
  }
  if (local_318 != (code *)0x0) {
    (*local_318)(&local_328,&local_328,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"/notfound","");
  local_348 = 0;
  uStack_340 = 0;
  pcStack_410 = std::
                _Function_handler<void_(clask::response_writer_&,_clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/main.cxx:9:22)>
                ::_M_invoke;
  local_428._M_unused._M_object = (void *)0x0;
  local_428._8_8_ = 0;
  local_418 = std::
              _Function_handler<void_(clask::response_writer_&,_clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/main.cxx:9:22)>
              ::_M_manager;
  local_338 = (code *)0x0;
  uStack_330 = 0;
  local_408._M_unused._M_object = (void *)0x0;
  local_408._8_8_ = 0;
  local_3f8 = (code *)0x0;
  pcStack_3f0 = (code *)0x0;
  local_3e8._M_unused._M_object = (void *)0x0;
  local_3e8._8_8_ = 0;
  local_3d8 = (code *)0x0;
  pcStack_3d0 = (code *)0x0;
  clask::server_t::parse_tree(&local_300,n,&local_448,(func_t *)&local_428);
  if (local_3d8 != (code *)0x0) {
    (*local_3d8)(&local_3e8,&local_3e8,__destroy_functor);
  }
  if (local_3f8 != (code *)0x0) {
    (*local_3f8)(&local_408,&local_408,__destroy_functor);
  }
  if (local_418 != (code *)0x0) {
    (*local_418)(&local_428,&local_428,3);
  }
  if (local_338 != (code *)0x0) {
    (*local_338)(&local_348,&local_348,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"/foo","");
  local_368 = 0;
  uStack_360 = 0;
  pcStack_410 = std::
                _Function_handler<void_(clask::response_writer_&,_clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/main.cxx:14:17)>
                ::_M_invoke;
  local_428._M_unused._M_object = (void *)0x0;
  local_428._8_8_ = 0;
  local_418 = std::
              _Function_handler<void_(clask::response_writer_&,_clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/main.cxx:14:17)>
              ::_M_manager;
  local_358 = (code *)0x0;
  uStack_350 = 0;
  local_408._M_unused._M_object = (void *)0x0;
  local_408._8_8_ = 0;
  local_3f8 = (code *)0x0;
  pcStack_3f0 = (code *)0x0;
  local_3e8._M_unused._M_object = (void *)0x0;
  local_3e8._8_8_ = 0;
  local_3d8 = (code *)0x0;
  pcStack_3d0 = (code *)0x0;
  clask::server_t::parse_tree(&local_300,n,&local_448,(func_t *)&local_428);
  if (local_3d8 != (code *)0x0) {
    (*local_3d8)(&local_3e8,&local_3e8,__destroy_functor);
  }
  if (local_3f8 != (code *)0x0) {
    (*local_3f8)(&local_408,&local_408,__destroy_functor);
  }
  if (local_418 != (code *)0x0) {
    (*local_418)(&local_428,&local_428,3);
  }
  if (local_358 != (code *)0x0) {
    (*local_358)(&local_368,&local_368,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"/zoo/:name","");
  local_388 = 0;
  uStack_380 = 0;
  local_418 = (code *)0x0;
  pcStack_410 = (code *)0x0;
  local_428._M_unused._M_object = (void *)0x0;
  local_428._8_8_ = 0;
  pcStack_3f0 = std::
                _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/main.cxx:19:23)>
                ::_M_invoke;
  local_408._M_unused._M_object = (void *)0x0;
  local_408._8_8_ = 0;
  local_3f8 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/main.cxx:19:23)>
              ::_M_manager;
  local_378 = (code *)0x0;
  uStack_370 = 0;
  local_3e8._M_unused._M_object = (void *)0x0;
  local_3e8._8_8_ = 0;
  local_3d8 = (code *)0x0;
  pcStack_3d0 = (code *)0x0;
  clask::server_t::parse_tree(&local_300,n,&local_448,(func_t *)&local_428);
  if (local_3d8 != (code *)0x0) {
    (*local_3d8)(&local_3e8,&local_3e8,__destroy_functor);
  }
  if (local_3f8 != (code *)0x0) {
    (*local_3f8)(&local_408,&local_408,__destroy_functor);
  }
  if (local_418 != (code *)0x0) {
    (*local_418)(&local_428,&local_428,3);
  }
  if (local_378 != (code *)0x0) {
    (*local_378)(&local_388,&local_388,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"/download","");
  local_3a8 = 0;
  uStack_3a0 = 0;
  pcStack_410 = std::
                _Function_handler<void_(clask::response_writer_&,_clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/main.cxx:23:22)>
                ::_M_invoke;
  local_428._M_unused._M_object = (void *)0x0;
  local_428._8_8_ = 0;
  local_418 = std::
              _Function_handler<void_(clask::response_writer_&,_clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/main.cxx:23:22)>
              ::_M_manager;
  local_398 = (code *)0x0;
  uStack_390 = 0;
  local_408._M_unused._M_object = (void *)0x0;
  local_408._8_8_ = 0;
  local_3f8 = (code *)0x0;
  pcStack_3f0 = (code *)0x0;
  local_3e8._M_unused._M_object = (void *)0x0;
  local_3e8._8_8_ = 0;
  local_3d8 = (code *)0x0;
  pcStack_3d0 = (code *)0x0;
  clask::server_t::parse_tree(&local_300,n,&local_448,(func_t *)&local_428);
  if (local_3d8 != (code *)0x0) {
    (*local_3d8)(&local_3e8,&local_3e8,__destroy_functor);
  }
  if (local_3f8 != (code *)0x0) {
    (*local_3f8)(&local_408,&local_408,__destroy_functor);
  }
  if (local_418 != (code *)0x0) {
    (*local_418)(&local_428,&local_428,3);
  }
  if (local_398 != (code *)0x0) {
    (*local_398)(&local_3a8,&local_3a8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"/bar","");
  local_3c8 = 0;
  uStack_3c0 = 0;
  local_3f8 = (code *)0x0;
  pcStack_3f0 = (code *)0x0;
  local_408._M_unused._M_object = (void *)0x0;
  local_408._8_8_ = 0;
  local_418 = (code *)0x0;
  pcStack_410 = (code *)0x0;
  local_428._M_unused._M_object = (void *)0x0;
  local_428._8_8_ = 0;
  pcStack_3d0 = std::
                _Function_handler<clask::response_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/main.cxx:34:17)>
                ::_M_invoke;
  local_3e8._M_unused._M_object = (void *)0x0;
  local_3e8._8_8_ = 0;
  local_3d8 = std::
              _Function_handler<clask::response_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/main.cxx:34:17)>
              ::_M_manager;
  local_3b8 = (code *)0x0;
  uStack_3b0 = 0;
  clask::server_t::parse_tree(&local_300,n,&local_448,(func_t *)&local_428);
  if (local_3d8 != (code *)0x0) {
    (*local_3d8)(&local_3e8,&local_3e8,__destroy_functor);
  }
  if (local_3f8 != (code *)0x0) {
    (*local_3f8)(&local_408,&local_408,__destroy_functor);
  }
  if (local_418 != (code *)0x0) {
    (*local_418)(&local_428,&local_428,3);
  }
  if (local_3b8 != (code *)0x0) {
    (*local_3b8)(&local_3c8,&local_3c8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_428._M_unused._M_object = &local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"/static/","");
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"./public","");
  clask::server_t::static_dir(&local_300,(string *)&local_428,&local_448,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  if ((code **)local_428._M_unused._0_8_ != &local_418) {
    operator_delete(local_428._M_unused._M_object,(ulong)(local_418 + 1));
  }
  local_428._8_8_ = 0;
  local_418 = (code *)((ulong)local_418 & 0xffffffffffffff00);
  local_428._M_unused._M_object = &local_418;
  clask::server_t::_run(&local_300,(string *)&local_428,0x1f90);
  if ((code **)local_428._M_unused._0_8_ != &local_418) {
    operator_delete(local_428._M_unused._M_object,(ulong)(local_418 + 1));
  }
  clask::server_t::~server_t(&local_300);
  return 0;
}

Assistant:

int main() {
  auto s = clask::server();
  s.GET("/", [](clask::request&) {
    return "OK!";
  });
  s.GET("/notfound", [](clask::response_writer& resp, clask::request&) {
    resp.code = 404;
    resp.set_header("content-type", "text/html");
    resp.write("Not Found");
  });
  s.GET("/foo", [](clask::response_writer& resp, clask::request&) {
    resp.set_header("content-type", "text/html");
    resp.write("he<b>l</b>lo");
    resp.end();
  });
  s.GET("/zoo/:name", [](clask::request& req) -> std::string {
    if (req.args.empty() || req.args[0].empty()) return "Wow!";
    return req.args[0];
  });
  s.GET("/download", [](clask::response_writer& resp, clask::request&) {
    resp.set_header("content-type", "application/octet-stream");
    resp.set_header("content-disposition", "attachment; filename=README.md");
    std::ifstream is("README.md", std::ios::in | std::ios::binary);
    char buf[BUFSIZ];
    while (!is.eof()) {
      auto size = is.read(buf, sizeof(buf)).gcount();
      resp.write(buf, (size_t) size);
    }
    resp.end();
  });
  s.GET("/bar", [](clask::request&) -> clask::response {
    return clask::response {
      .code = 200,
      .content = "hello",
      .headers = {
        { "X-Host", "hogehoge" },
      },
    };
  });
  s.static_dir("/static/", "./public", true);
  s.run();
}